

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O2

void duckdb::DecodeSortKeyArray
               (DecodeSortKeyData *decode_data,DecodeSortKeyVectorData *vector_data,Vector *result,
               idx_t result_idx)

{
  data_t dVar1;
  idx_t params_1;
  reference vector_data_00;
  InvalidInputException *this;
  ulong params;
  allocator local_5d;
  uint local_5c;
  Vector *local_58;
  string local_50;
  
  dVar1 = decode_data->data[decode_data->position];
  decode_data->position = decode_data->position + 1;
  if (dVar1 == vector_data->null_byte) {
    FlatVector::VerifyFlatVector(result);
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&(result->validity).super_TemplatedValidityMask<unsigned_long>,result_idx);
  }
  local_5c = 0xff;
  if (vector_data->flip_bytes == false) {
    local_5c = 0;
  }
  local_58 = ArrayVector::GetEntry(result);
  params_1 = ArrayType::GetSize(&result->type);
  params = 0;
  do {
    if (local_5c == decode_data->data[decode_data->position]) {
LAB_0155b000:
      decode_data->position = decode_data->position + 1;
      if (params == params_1) {
        return;
      }
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,"Failed to decode array - found %d elements but expected %d",
                 &local_5d);
      InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
                (this,&local_50,params,params_1);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (params_1 < params + 1) {
      params = params + 1;
      goto LAB_0155b000;
    }
    vector_data_00 =
         vector<duckdb::DecodeSortKeyVectorData,_true>::get<true>(&vector_data->child_data,0);
    DecodeSortKeyRecursive(decode_data,vector_data_00,local_58,params + result_idx * params_1);
    params = params + 1;
  } while( true );
}

Assistant:

void DecodeSortKeyArray(DecodeSortKeyData &decode_data, DecodeSortKeyVectorData &vector_data, Vector &result,
                        idx_t result_idx) {
	// check if the top-level is valid or not
	auto validity_byte = decode_data.data[decode_data.position];
	decode_data.position++;
	if (validity_byte == vector_data.null_byte) {
		// entire array is NULL
		// note that we still read the child elements
		FlatVector::Validity(result).SetInvalid(result_idx);
	}
	// array is valid - decode child elements
	// arrays need to encode exactly array_size child elements
	// however the decoded data still contains a list delimiter
	// we use this delimiter to verify we successfully decoded the entire array
	auto list_delimiter = SortKeyVectorData::LIST_DELIMITER;
	if (vector_data.flip_bytes) {
		list_delimiter = ~list_delimiter;
	}
	auto &child_vector = ArrayVector::GetEntry(result);
	auto array_size = ArrayType::GetSize(result.GetType());

	idx_t found_elements = 0;
	auto child_start = array_size * result_idx;
	// loop until we find the list delimiter
	while (decode_data.data[decode_data.position] != list_delimiter) {
		found_elements++;
		if (found_elements > array_size) {
			// error - found too many elements
			break;
		}
		// now decode the entry
		DecodeSortKeyRecursive(decode_data, vector_data.child_data[0], child_vector, child_start + found_elements - 1);
	}
	// skip the list delimiter
	decode_data.position++;
	if (found_elements != array_size) {
		throw InvalidInputException("Failed to decode array - found %d elements but expected %d", found_elements,
		                            array_size);
	}
}